

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

xmlParserInputPtr pythonExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  PyObject *op;
  PyObject *op_00;
  undefined8 *puVar2;
  PyTypeObject *pPVar3;
  xmlParserInputBufferPtr buf;
  PyObject *ctxtobj;
  PyObject *ret;
  xmlParserInputPtr result;
  xmlParserCtxtPtr ctxt_local;
  char *ID_local;
  char *URL_local;
  
  ret = (PyObject *)0x0;
  if (pythonExternalEntityLoaderObjext != (PyObject *)0x0) {
    op = libxml_xmlParserCtxtPtrWrap(ctxt);
    op_00 = (PyObject *)
            _PyObject_CallFunction_SizeT(pythonExternalEntityLoaderObjext,"(ssO)",URL,ID,op);
    _Py_XDECREF(op);
    if (op_00 != (PyObject *)0x0) {
      iVar1 = PyObject_HasAttrString(op_00,"read");
      if ((iVar1 != 0) &&
         (puVar2 = (undefined8 *)xmlAllocParserInputBuffer(0), puVar2 != (undefined8 *)0x0)) {
        *puVar2 = op_00;
        puVar2[1] = xmlPythonFileReadRaw;
        puVar2[2] = xmlPythonFileCloseRaw;
        ret = (PyObject *)xmlNewIOInputStream(ctxt,puVar2,0);
      }
      if (ret == (PyObject *)0x0) {
        _Py_DECREF(op_00);
      }
      else if (URL != (char *)0x0) {
        pPVar3 = (PyTypeObject *)xmlStrdup(URL);
        ret->ob_type = pPVar3;
      }
    }
  }
  if ((ret == (PyObject *)0x0) && (defaultExternalEntityLoader != (xmlExternalEntityLoader)0x0)) {
    ret = (PyObject *)(*defaultExternalEntityLoader)(URL,ID,ctxt);
  }
  return (xmlParserInputPtr)ret;
}

Assistant:

static xmlParserInputPtr
pythonExternalEntityLoader(const char *URL, const char *ID,
			   xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr result = NULL;
    if (pythonExternalEntityLoaderObjext != NULL) {
	PyObject *ret;
	PyObject *ctxtobj;

	ctxtobj = libxml_xmlParserCtxtPtrWrap(ctxt);

	ret = PyObject_CallFunction(pythonExternalEntityLoaderObjext,
		      (char *) "(ssO)", URL, ID, ctxtobj);
	Py_XDECREF(ctxtobj);

	if (ret != NULL) {
	    if (PyObject_HasAttrString(ret, (char *) "read")) {
		xmlParserInputBufferPtr buf;

		buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
		if (buf != NULL) {
		    buf->context = ret;
		    buf->readcallback = xmlPythonFileReadRaw;
		    buf->closecallback = xmlPythonFileCloseRaw;
		    result = xmlNewIOInputStream(ctxt, buf,
			                         XML_CHAR_ENCODING_NONE);
		}
#if 0
	    } else {
		if (URL != NULL)
		    printf("pythonExternalEntityLoader: can't read %s\n",
		           URL);
#endif
	    }
	    if (result == NULL) {
		Py_DECREF(ret);
	    } else if (URL != NULL) {
		result->filename = (char *) xmlStrdup((const xmlChar *)URL);
	    }
	}
    }
    if ((result == NULL) && (defaultExternalEntityLoader != NULL)) {
	result = defaultExternalEntityLoader(URL, ID, ctxt);
    }
    return(result);
}